

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

void __thiscall cmCustomCommandGenerator::FillEmulatorsWithArguments(cmCustomCommandGenerator *this)

{
  cmLocalGenerator *lg;
  string_view arg;
  cmValue this_00;
  bool bVar1;
  uint uVar2;
  TargetType TVar3;
  cmMakefile *this_01;
  cmake *cmakeInstance;
  cmListFileBacktrace *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  reference name;
  string *psVar5;
  pointer this_03;
  reference argsOut;
  string local_120;
  string local_100 [32];
  undefined1 local_e0 [16];
  string emulator;
  string local_b0;
  cmValue local_90;
  cmValue emulator_property;
  cmGeneratorTarget *target;
  string *argv0;
  undefined1 local_70 [4];
  uint c;
  undefined1 local_60 [8];
  cmGeneratorExpression ge;
  allocator<char> local_31;
  string local_30;
  cmCustomCommandGenerator *local_10;
  cmCustomCommandGenerator *this_local;
  
  local_10 = this;
  this_01 = cmLocalGenerator::GetMakefile(this->LG);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_CROSSCOMPILING",&local_31);
  bVar1 = cmMakefile::IsOn(this_01,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    cmakeInstance = cmLocalGenerator::GetCMakeInstance(this->LG);
    pcVar4 = cmCustomCommand::GetBacktrace(this->CC);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_70,pcVar4);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_60,cmakeInstance,(cmListFileBacktrace *)local_70);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_70);
    for (argv0._4_4_ = 0; uVar2 = GetNumberOfCommands(this), argv0._4_4_ < uVar2;
        argv0._4_4_ = argv0._4_4_ + 1) {
      this_02 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                           (&(this->CommandLines).
                             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                            ,(ulong)argv0._4_4_)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      name = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_02,0);
      emulator_property.Value = (string *)cmLocalGenerator::FindGeneratorTargetToUse(this->LG,name);
      if ((((cmGeneratorTarget *)emulator_property.Value != (cmGeneratorTarget *)0x0) &&
          (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)emulator_property.Value),
          TVar3 == EXECUTABLE)) &&
         (bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)emulator_property.Value),
         this_00 = emulator_property, !bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"CROSSCOMPILING_EMULATOR",
                   (allocator<char> *)(emulator.field_2._M_local_buf + 0xf));
        local_90 = cmGeneratorTarget::GetProperty(this_00.Value,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)(emulator.field_2._M_local_buf + 0xf));
        bVar1 = cmValue::operator_cast_to_bool(&local_90);
        if (bVar1) {
          psVar5 = cmValue::operator*[abi_cxx11_(&local_90);
          std::__cxx11::string::string(local_100,(string *)psVar5);
          cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e0,(string *)local_60);
          this_03 = std::
                    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  *)local_e0);
          lg = this->LG;
          std::__cxx11::string::string((string *)&local_120);
          psVar5 = cmCompiledGeneratorExpression::Evaluate
                             (this_03,lg,&this->CommandConfig,(cmGeneratorTarget *)0x0,
                              (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                              &local_120);
          std::__cxx11::string::string((string *)(local_e0 + 8),(string *)psVar5);
          std::__cxx11::string::~string((string *)&local_120);
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)local_e0);
          std::__cxx11::string::~string(local_100);
          arg = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_e0 + 8));
          argsOut = std::
                    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[](&this->EmulatorsWithArguments,(ulong)argv0._4_4_);
          cmExpandList(arg,argsOut,No);
          std::__cxx11::string::~string((string *)(local_e0 + 8));
        }
      }
    }
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_60);
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::FillEmulatorsWithArguments()
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return;
  }
  cmGeneratorExpression ge(*this->LG->GetCMakeInstance(),
                           this->CC->GetBacktrace());

  for (unsigned int c = 0; c < this->GetNumberOfCommands(); ++c) {
    // If the command is the plain name of an executable target,
    // launch it with its emulator.
    std::string const& argv0 = this->CommandLines[c][0];
    cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
    if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
        !target->IsImported()) {

      cmValue emulator_property =
        target->GetProperty("CROSSCOMPILING_EMULATOR");
      if (!emulator_property) {
        continue;
      }

      // Plain target names are replaced by GetArgv0Location with the
      // path to the executable artifact in the command config, so
      // evaluate the launcher's location in the command config too.
      std::string const emulator =
        ge.Parse(*emulator_property)->Evaluate(this->LG, this->CommandConfig);
      cmExpandList(emulator, this->EmulatorsWithArguments[c]);
    }
  }
}